

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

float ImGuiStb::STB_TEXTEDIT_GETWIDTH(ImGuiTextEditState *obj,int line_start_idx,int char_idx)

{
  value_type_conflict1 *pvVar1;
  float fVar2;
  
  pvVar1 = ImVector<unsigned_short>::operator[](&obj->Text,line_start_idx + char_idx);
  if (*pvVar1 == 10) {
    fVar2 = -1.0;
  }
  else {
    fVar2 = ImFont::GetCharAdvance(GImGui->Font,*pvVar1);
    fVar2 = (GImGui->FontSize / GImGui->Font->FontSize) * fVar2;
  }
  return fVar2;
}

Assistant:

static float   STB_TEXTEDIT_GETWIDTH(STB_TEXTEDIT_STRING* obj, int line_start_idx, int char_idx)  { ImWchar c = obj->Text[line_start_idx+char_idx]; if (c == '\n') return STB_TEXTEDIT_GETWIDTH_NEWLINE; return GImGui->Font->GetCharAdvance(c) * (GImGui->FontSize / GImGui->Font->FontSize); }